

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall
Omega_h::Read<long>::Read(Read<long> *this,LO size_in,long offset,long stride,string *name_in)

{
  Write<long> local_40;
  string *local_30;
  string *name_in_local;
  long stride_local;
  long offset_local;
  Read<long> *pRStack_10;
  LO size_in_local;
  Read<signed_char> *this_local;
  
  local_30 = name_in;
  name_in_local = (string *)stride;
  stride_local = offset;
  offset_local._4_4_ = size_in;
  pRStack_10 = this;
  Write<long>::Write(&local_40,size_in,offset,stride,name_in);
  Read(this,&local_40);
  Write<long>::~Write(&local_40);
  return;
}

Assistant:

Read<T>::Read(LO size_in, T offset, T stride, std::string const& name_in)
    : Read<T>(Write<T>(size_in, offset, stride, name_in)) {}